

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageLessEqual(StackInterpreter *this)

{
  uint8_t **ppuVar1;
  StackMemory *pSVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar3;
  size_t sVar4;
  uint8_t *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  SmallIntegerValue SVar9;
  SmallIntegerValue SVar10;
  undefined8 *puVar11;
  double dVar12;
  double dVar13;
  Oop b;
  Oop a;
  
  pSVar2 = this->stack;
  paVar3 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(pSVar2->stackFrame).stackPointer;
  a.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar3[1].uintValue;
  b.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar3->uintValue;
  if ((SUB84(b.field_0.uintValue,0) & SUB84(a.field_0.uintValue,0) & 1) == 0) {
    if ((SUB84(b.field_0.uintValue,0) & 7) == 2 && (SUB84(a.field_0.uintValue,0) & 7) == 2) {
      sVar4 = this->pc;
      this->pc = sVar4 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar4);
      (pSVar2->stackFrame).stackPointer = (uint8_t *)(paVar3 + 2);
      iVar7 = Oop::decodeCharacter(&a);
      iVar8 = Oop::decodeCharacter(&b);
      if (iVar7 <= iVar8) {
LAB_001517b2:
        puVar11 = &TrueObject;
        goto LAB_001517b9;
      }
    }
    else {
      bVar6 = Oop::isFloatOrInt(&a);
      if ((!bVar6) || (bVar6 = Oop::isFloatOrInt(&b), !bVar6)) {
        sendSpecialArgumentCount(this,LessEqual,1);
        return;
      }
      sVar4 = this->pc;
      this->pc = sVar4 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar4);
      ppuVar1 = &(this->stack->stackFrame).stackPointer;
      *ppuVar1 = *ppuVar1 + 0x10;
      dVar12 = Oop::decodeFloatOrInt(&a);
      dVar13 = Oop::decodeFloatOrInt(&b);
      if (dVar12 <= dVar13) goto LAB_001517b2;
    }
  }
  else {
    sVar4 = this->pc;
    this->pc = sVar4 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar4);
    (pSVar2->stackFrame).stackPointer = (uint8_t *)(paVar3 + 2);
    SVar9 = Oop::decodeSmallInteger(&a);
    SVar10 = Oop::decodeSmallInteger(&b);
    if (SVar9 <= SVar10) goto LAB_001517b2;
  }
  puVar11 = &FalseObject;
LAB_001517b9:
  puVar5 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar5 + -8;
  *(undefined8 **)(puVar5 + -8) = puVar11;
  return;
}

Assistant:

void interpretSpecialMessageLessEqual()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushBoolean(ia <= ib);
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushBoolean(ca <= cb);
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushBoolean(fa <= fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::LessEqual, 1);
        }
    }